

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator(RuleBasedCollator *this,CollationCacheEntry *entry)

{
  CollationCacheEntry *entry_local;
  RuleBasedCollator *this_local;
  
  Collator::Collator(&this->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_004aa600;
  this->data = entry->tailoring->data;
  this->settings = entry->tailoring->settings;
  this->tailoring = entry->tailoring;
  this->cacheEntry = entry;
  Locale::Locale(&this->validLocale,&entry->validLocale);
  this->explicitlySetAttributes = 0;
  this->actualLocaleIsSameAsValid = '\0';
  SharedObject::addRef(&this->settings->super_SharedObject);
  SharedObject::addRef(&this->cacheEntry->super_SharedObject);
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const CollationCacheEntry *entry)
        : data(entry->tailoring->data),
          settings(entry->tailoring->settings),
          tailoring(entry->tailoring),
          cacheEntry(entry),
          validLocale(entry->validLocale),
          explicitlySetAttributes(0),
          actualLocaleIsSameAsValid(FALSE) {
    settings->addRef();
    cacheEntry->addRef();
}